

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall sznet::net::Buffer::ensureWritableBytes(Buffer *this,size_t len)

{
  ulong uVar1;
  
  uVar1 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + this->m_writerIndex);
  if (uVar1 < len) {
    makeSpace(this,len);
    uVar1 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + this->m_writerIndex);
  }
  if (len <= uVar1) {
    return;
  }
  __assert_fail("writableBytes() >= len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0xc6,"void sznet::net::Buffer::ensureWritableBytes(size_t)");
}

Assistant:

void ensureWritableBytes(size_t len)
	{
		if (writableBytes() < len)
		{
			makeSpace(len);
		}
		assert(writableBytes() >= len);
	}